

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_geometric.h
# Opt level: O2

Matrix3x4 * __thiscall
Matrix3x4::operator*(Matrix3x4 *__return_storage_ptr__,Matrix3x4 *this,Matrix3x4 *other)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined8 uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  fVar10 = other->m[0][0];
  fVar1 = this->m[0][0];
  fVar2 = this->m[0][1];
  fVar11 = other->m[1][0];
  fVar3 = this->m[0][2];
  fVar4 = other->m[2][0];
  fVar12 = other->m[0][1];
  fVar13 = other->m[0][2];
  fVar14 = other->m[1][1];
  fVar15 = other->m[1][2];
  uVar9 = *(undefined8 *)(other->m[2] + 1);
  fVar5 = other->m[0][3];
  fVar16 = (float)uVar9;
  fVar17 = (float)((ulong)uVar9 >> 0x20);
  fVar6 = other->m[1][3];
  fVar7 = other->m[2][3];
  fVar8 = this->m[0][3];
  __return_storage_ptr__->m[0][0] = fVar4 * fVar3 + fVar1 * fVar10 + fVar11 * fVar2;
  __return_storage_ptr__->m[0][1] = fVar3 * fVar16 + fVar1 * fVar12 + fVar14 * fVar2;
  __return_storage_ptr__->m[0][2] = fVar3 * fVar17 + fVar1 * fVar13 + fVar15 * fVar2;
  __return_storage_ptr__->m[0][3] = fVar8 + fVar3 * fVar7 + fVar5 * fVar1 + fVar6 * fVar2;
  fVar1 = this->m[1][0];
  fVar2 = this->m[1][1];
  fVar3 = this->m[1][2];
  fVar8 = this->m[1][3];
  __return_storage_ptr__->m[1][0] = fVar3 * fVar4 + fVar1 * fVar10 + fVar2 * fVar11;
  __return_storage_ptr__->m[1][1] = fVar3 * fVar16 + fVar1 * fVar12 + fVar2 * fVar14;
  __return_storage_ptr__->m[1][2] = fVar3 * fVar17 + fVar1 * fVar13 + fVar2 * fVar15;
  __return_storage_ptr__->m[1][3] = fVar8 + fVar3 * fVar7 + fVar1 * fVar5 + fVar2 * fVar6;
  fVar1 = this->m[2][0];
  fVar2 = this->m[2][1];
  fVar3 = this->m[2][2];
  fVar8 = this->m[2][3];
  __return_storage_ptr__->m[2][0] = fVar4 * fVar3 + fVar1 * fVar10 + fVar11 * fVar2;
  __return_storage_ptr__->m[2][1] = fVar3 * fVar16 + fVar1 * fVar12 + fVar14 * fVar2;
  __return_storage_ptr__->m[2][2] = fVar3 * fVar17 + fVar1 * fVar13 + fVar15 * fVar2;
  __return_storage_ptr__->m[2][3] = fVar8 + fVar3 * fVar7 + fVar5 * fVar1 + fVar6 * fVar2;
  return __return_storage_ptr__;
}

Assistant:

Matrix3x4 operator *(const Matrix3x4 &other)
	{
		Matrix3x4 result;

		result.m[0][0] = m[0][0]*other.m[0][0] + m[0][1]*other.m[1][0] + m[0][2]*other.m[2][0];
		result.m[0][1] = m[0][0]*other.m[0][1] + m[0][1]*other.m[1][1] + m[0][2]*other.m[2][1];
		result.m[0][2] = m[0][0]*other.m[0][2] + m[0][1]*other.m[1][2] + m[0][2]*other.m[2][2];
		result.m[0][3] = m[0][0]*other.m[0][3] + m[0][1]*other.m[1][3] + m[0][2]*other.m[2][3] + m[0][3];

		result.m[1][0] = m[1][0]*other.m[0][0] + m[1][1]*other.m[1][0] + m[1][2]*other.m[2][0];
		result.m[1][1] = m[1][0]*other.m[0][1] + m[1][1]*other.m[1][1] + m[1][2]*other.m[2][1];
		result.m[1][2] = m[1][0]*other.m[0][2] + m[1][1]*other.m[1][2] + m[1][2]*other.m[2][2];
		result.m[1][3] = m[1][0]*other.m[0][3] + m[1][1]*other.m[1][3] + m[1][2]*other.m[2][3] + m[1][3];

		result.m[2][0] = m[2][0]*other.m[0][0] + m[2][1]*other.m[1][0] + m[2][2]*other.m[2][0];
		result.m[2][1] = m[2][0]*other.m[0][1] + m[2][1]*other.m[1][1] + m[2][2]*other.m[2][1];
		result.m[2][2] = m[2][0]*other.m[0][2] + m[2][1]*other.m[1][2] + m[2][2]*other.m[2][2];
		result.m[2][3] = m[2][0]*other.m[0][3] + m[2][1]*other.m[1][3] + m[2][2]*other.m[2][3] + m[2][3];

		return result;
	}